

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O2

wchar_t ui_entry_search_categories(ui_entry *entry,char *name,int *ind)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  
  wVar2 = entry->n_category;
  wVar3 = L'\0';
  do {
    wVar5 = wVar2;
    if (wVar3 == wVar5) {
      wVar2 = L'\0';
LAB_001d2e06:
      *ind = wVar5;
      return wVar2;
    }
    wVar4 = (wVar3 + wVar5) / 2;
    iVar1 = strcmp(entry->categories[wVar4].name,name);
    if (iVar1 == 0) {
      wVar2 = L'\x01';
      wVar5 = wVar4;
      goto LAB_001d2e06;
    }
    wVar2 = wVar4;
    if (iVar1 < 0) {
      wVar2 = wVar5;
      wVar3 = wVar4 + L'\x01';
    }
  } while( true );
}

Assistant:

static int ui_entry_search_categories(const struct ui_entry *entry,
	const char *name, int *ind)
{
	/* They're sorted by name so use a binary search. */
	int ilow = 0, ihigh = entry->n_category;

	while (1) {
		int imid, cmp;

		if (ilow == ihigh) {
			*ind = ilow;
			return 0;
		}
		imid = (ilow + ihigh) / 2;
		cmp = strcmp(entry->categories[imid].name, name);
		if (cmp == 0) {
			*ind = imid;
			return 1;
		}
		if (cmp < 0) {
			ilow = imid + 1;
		} else {
			ihigh = imid;
		}
	}
}